

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationRuleParser::parseSpecialPosition
          (CollationRuleParser *this,int32_t i,UnicodeString *str,UErrorCode *errorCode)

{
  undefined4 uVar1;
  UBool UVar2;
  uint uVar3;
  int iVar4;
  UnicodeString *pUVar5;
  uint uVar6;
  undefined4 len;
  long lVar7;
  char16_t *pcVar8;
  short sVar9;
  bool bVar10;
  UnicodeString raw;
  ConstChar16Ptr local_f0;
  ConstChar16Ptr local_e8;
  UnicodeString local_e0;
  CollationRuleParser *local_a0;
  ulong local_98;
  char16_t *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  uVar3 = readWords(this,i + 1,&local_70);
  if (i < (int)uVar3) {
    pUVar5 = this->rules;
    sVar9 = (pUVar5->fUnion).fStackFields.fLengthAndFlags;
    if (sVar9 < 0) {
      uVar6 = (pUVar5->fUnion).fFields.fLength;
    }
    else {
      uVar6 = (int)sVar9 >> 5;
    }
    if (uVar3 < uVar6) {
      if (((int)sVar9 & 2U) == 0) {
        pcVar8 = (pUVar5->fUnion).fFields.fArray;
      }
      else {
        pcVar8 = (char16_t *)((long)&pUVar5->fUnion + 2);
      }
      if ((pcVar8[(int)uVar3] == L']') &&
         (0x1f < (ushort)local_70.fUnion.fStackFields.fLengthAndFlags)) {
        iVar4 = uVar3 + 1;
        sVar9 = 0x2800;
        lVar7 = 0;
        local_a0 = this;
        local_98 = (ulong)(uint)i;
        do {
          UnicodeString::UnicodeString
                    (&local_e0,
                     (char *)((long)&_ZN6icu_6312_GLOBAL__N_19positionsE_rel +
                             (long)*(int *)((long)&_ZN6icu_6312_GLOBAL__N_19positionsE_rel + lVar7))
                     ,-1,kInvariant);
          if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
            len = local_70.fUnion.fFields.fLength;
            if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
              len = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            uVar1 = local_e0.fUnion.fFields.fLength;
            if (-1 < local_e0.fUnion.fStackFields.fLengthAndFlags) {
              uVar1 = (int)local_e0.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            bVar10 = false;
            if ((((int)local_e0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
               (bVar10 = false, len == uVar1)) {
              UVar2 = UnicodeString::doEquals(&local_70,&local_e0,len);
              bVar10 = UVar2 != '\0';
            }
          }
          else {
            bVar10 = (bool)(local_e0.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
          }
          UnicodeString::~UnicodeString(&local_e0);
          if (bVar10 != false) {
            pUVar5 = UnicodeString::setTo(str,L'\xfffe');
            local_e0.super_Replaceable.super_UObject._vptr_UObject._0_2_ = sVar9;
            UnicodeString::doAppend(pUVar5,(UChar *)&local_e0,0,1);
            goto LAB_0023f3e2;
          }
          lVar7 = lVar7 + 4;
          sVar9 = sVar9 + 1;
        } while (lVar7 != 0x38);
        local_e8.p_ = L"top";
        UnicodeString::UnicodeString(&local_e0,'\x01',&local_e8,-1);
        if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
          if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
            local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5
            ;
          }
          if (-1 < local_e0.fUnion.fStackFields.fLengthAndFlags) {
            local_e0.fUnion.fFields.fLength = (int)local_e0.fUnion.fStackFields.fLengthAndFlags >> 5
            ;
          }
          bVar10 = false;
          if ((((int)local_e0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
             (bVar10 = false, local_70.fUnion.fFields.fLength == local_e0.fUnion.fFields.fLength)) {
            UVar2 = UnicodeString::doEquals(&local_70,&local_e0,local_70.fUnion.fFields.fLength);
            bVar10 = UVar2 != '\0';
          }
        }
        else {
          bVar10 = (bool)(local_e0.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
        }
        UnicodeString::~UnicodeString(&local_e0);
        local_80 = local_e8.p_;
        if (bVar10 != false) {
          pUVar5 = UnicodeString::setTo(str,L'\xfffe');
          local_e0.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x2809;
          UnicodeString::doAppend(pUVar5,(UChar *)&local_e0,0,1);
          goto LAB_0023f3e2;
        }
        local_f0.p_ = L"variable top";
        UnicodeString::UnicodeString(&local_e0,'\x01',&local_f0,-1);
        UVar2 = UnicodeString::operator==(&local_70,&local_e0);
        UnicodeString::~UnicodeString(&local_e0);
        local_90 = local_f0.p_;
        this = local_a0;
        i = (int)local_98;
        if (UVar2 != '\0') {
          pUVar5 = UnicodeString::setTo(str,L'\xfffe');
          local_e0.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x2807;
          UnicodeString::doAppend(pUVar5,(UChar *)&local_e0,0,1);
          goto LAB_0023f3e2;
        }
      }
    }
  }
  iVar4 = i;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    *errorCode = U_INVALID_FORMAT_ERROR;
    this->errorReason = "not a valid special reset position";
    if (this->parseError != (UParseError *)0x0) {
      setErrorContext(this);
    }
  }
LAB_0023f3e2:
  UnicodeString::~UnicodeString(&local_70);
  return iVar4;
}

Assistant:

int32_t
CollationRuleParser::parseSpecialPosition(int32_t i, UnicodeString &str, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    UnicodeString raw;
    int32_t j = readWords(i + 1, raw);
    if(j > i && rules->charAt(j) == 0x5d && !raw.isEmpty()) {  // words end with ]
        ++j;
        for(int32_t pos = 0; pos < UPRV_LENGTHOF(positions); ++pos) {
            if(raw == UnicodeString(positions[pos], -1, US_INV)) {
                str.setTo((UChar)POS_LEAD).append((UChar)(POS_BASE + pos));
                return j;
            }
        }
        if(raw == UNICODE_STRING_SIMPLE("top")) {
            str.setTo((UChar)POS_LEAD).append((UChar)(POS_BASE + LAST_REGULAR));
            return j;
        }
        if(raw == UNICODE_STRING_SIMPLE("variable top")) {
            str.setTo((UChar)POS_LEAD).append((UChar)(POS_BASE + LAST_VARIABLE));
            return j;
        }
    }
    setParseError("not a valid special reset position", errorCode);
    return i;
}